

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Skiplist.cpp
# Opt level: O2

bool __thiscall Skiplist::put(Skiplist *this,uint64_t k,string *v,bool d)

{
  _List_node_base *p_Var1;
  bool bVar2;
  uint uVar3;
  Quadlist *pQVar4;
  Quadlistnode *b;
  Entry *e_00;
  Quadlistnode *p;
  _List_node_base *p_Var5;
  reverse_iterator temp;
  Quadlist *newTop;
  Quadlistnode *local_68;
  iterator qlist;
  Entry e;
  
  Entry::Entry(&e);
  e.key = k;
  std::__cxx11::string::_M_assign((string *)&e.value);
  qlist._M_node =
       (this->super_list<Quadlist_*,_std::allocator<Quadlist_*>_>).
       super__List_base<Quadlist_*,_std::allocator<Quadlist_*>_>._M_impl._M_node.
       super__List_node_base._M_next;
  if (qlist._M_node == (_List_node_base *)this) {
    pQVar4 = (Quadlist *)operator_new(0x18);
    Quadlist::init(pQVar4,(EVP_PKEY_CTX *)v);
    qlist._M_node = (_List_node_base *)pQVar4;
    std::__cxx11::list<Quadlist_*,_std::allocator<Quadlist_*>_>::push_front
              (&this->super_list<Quadlist_*,_std::allocator<Quadlist_*>_>,(value_type *)&qlist);
    qlist._M_node =
         (this->super_list<Quadlist_*,_std::allocator<Quadlist_*>_>).
         super__List_base<Quadlist_*,_std::allocator<Quadlist_*>_>._M_impl._M_node.
         super__List_node_base._M_next;
  }
  local_68 = (Quadlistnode *)(qlist._M_node[1]._M_next)->_M_prev[3]._M_prev;
  bVar2 = skipSearch1(this,&qlist,&local_68,k);
  p = local_68;
  if (bVar2) {
    std::__cxx11::string::_M_assign((string *)&(local_68->entry).value);
    while( true ) {
      p->del = d;
      p = p->below;
      if (p == (Quadlistnode *)0x0) break;
      std::__cxx11::string::_M_assign((string *)&(p->entry).value);
    }
  }
  else {
    e_00 = &e;
    b = Quadlist::insertAfterAbove
                  ((Quadlist *)
                   (this->super_list<Quadlist_*,_std::allocator<Quadlist_*>_>).
                   super__List_base<Quadlist_*,_std::allocator<Quadlist_*>_>._M_impl._M_node.
                   super__List_node_base._M_prev[1]._M_next,e_00,local_68,(Quadlistnode *)0x0,d);
    p_Var5 = (_List_node_base *)this;
    while( true ) {
      uVar3 = rand();
      if ((uVar3 & 1) == 0) break;
      p_Var1 = p_Var5->_M_prev;
      for (; ((p != (Quadlistnode *)0x0 && ((Quadlistnode *)p_Var1[1]._M_next[1]._M_next != p)) &&
             ((Quadlistnode *)(p_Var1[1]._M_next)->_M_prev != p)); p = p->pred) {
        if (p->above != (Quadlistnode *)0x0) {
          p = p->above;
          p_Var5 = p_Var1;
          goto LAB_00104715;
        }
      }
      if (p_Var1 == (this->super_list<Quadlist_*,_std::allocator<Quadlist_*>_>).
                    super__List_base<Quadlist_*,_std::allocator<Quadlist_*>_>._M_impl._M_node.
                    super__List_node_base._M_next) {
        pQVar4 = (Quadlist *)operator_new(0x18);
        Quadlist::init(pQVar4,(EVP_PKEY_CTX *)e_00);
        newTop = pQVar4;
        std::__cxx11::list<Quadlist_*,_std::allocator<Quadlist_*>_>::push_front
                  (&this->super_list<Quadlist_*,_std::allocator<Quadlist_*>_>,&newTop);
        p = newTop->header->succ->pred;
        p_Var5 = p_Var5->_M_prev;
      }
      else {
        p = (Quadlistnode *)(p_Var1->_M_prev[1]._M_next)->_M_prev[3]._M_prev[3]._M_next;
        p_Var5 = p_Var1;
      }
LAB_00104715:
      e_00 = &e;
      b = Quadlist::insertAfterAbove((Quadlist *)p_Var5->_M_prev[1]._M_next,e_00,p,b,d);
    }
  }
  std::__cxx11::string::~string((string *)&e.value);
  return true;
}

Assistant:

bool Skiplist::put(uint64_t k,const std::string &v,bool d) {
    Entry e;

    e.key=k;
    e.value=v;


    if(empty())
    {
        Quadlist * bottomm = new Quadlist();
        push_front(bottomm);

    }

    list::iterator qlist=begin();   //顶层那条四联表  用迭代器！！！
    Quadlistnode * p=(*qlist)->first();//顶层四联表的第一个元素

    //如果找到这个元素 改变他的值 为v
    //memtable里的k不重复 插入相同k直接覆盖
    if(skipSearch1(qlist,p,k))  //这里传的都是引用哦！！
    {
//        big-=p->entry.value.size();
      //  big+=v.size();
        p->entry.value=v;
        p->del=d;
        while (p->below)
        {
            p=p->below;
            p->entry.value=v;
            p->del=d;
        }
        return true;

    }


    //skipSearch之后 如果没找到 qlist就是底层，p是比k小的最大的那个
    list::reverse_iterator r_qlist=rbegin();
    Quadlistnode * b = (*r_qlist)->insertAfterAbove(e,p,nullptr,d); //新底座
    while(rand()&1)
    {
        //找到这条链比k小的 并且头上有东西的
        while ((*r_qlist)->valid(p) && !p->above) p=p->pred;

        //如果pred是header 就说明 比k小的没有这么高的了
        if(!(*r_qlist)->valid(p))
        {
            reverse_iterator temp =r_qlist;
            temp++;
            if(temp==rend()) //说明是顶层了
            {
                //新建一层
                Quadlist * newTop = new Quadlist();
                push_front(newTop);

                p=newTop->first()->pred;
            } else {
                reverse_iterator temp = r_qlist;
                temp++;
                p = (*temp)->first()->pred;  //让p等于上一层的header (private)}
            }

        }
        else{
            p=p->above;
        }

        r_qlist++;//上升一层
        b= (*r_qlist)->insertAfterAbove(e,p,b,d);
    }


    return true;
}